

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfor.h
# Opt level: O0

void __thiscall
FastPForLib::PFor::uncompressblockPFOR
          (PFor *this,uint32_t *inputbegin,DATATYPE *outputbegin,uint32_t b,DATATYPE **i,
          DATATYPE *end_exception,size_t next_exception)

{
  uint uVar1;
  undefined4 *puVar2;
  undefined4 in_ECX;
  long in_RDX;
  uint32_t *in_R8;
  uint32_t *in_R9;
  size_t cur;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe0;
  
  unpackblock((PFor *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_R8,in_R9,
              (uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  while (*(uint32_t **)in_R8 != in_R9) {
    uVar1 = *(uint *)(in_RDX + (long)end_exception * 4);
    puVar2 = *(undefined4 **)in_R8;
    *(undefined4 **)in_R8 = puVar2 + 1;
    *(undefined4 *)(in_RDX + (long)end_exception * 4) = *puVar2;
    end_exception = (DATATYPE *)((long)end_exception + (ulong)uVar1 + 1);
  }
  return;
}

Assistant:

void uncompressblockPFOR(
      const uint32_t
          *__restrict__ inputbegin, // points to the first packed word
      DATATYPE *__restrict__ outputbegin,
      const uint32_t b,
      const DATATYPE *__restrict__
          &i, // i points to value of the first exception
      const DATATYPE *__restrict__ end_exception,
      size_t next_exception // points to the position of the first exception
      ) {
    unpackblock(inputbegin, reinterpret_cast<uint32_t *>(outputbegin),
                b); /* bit-unpack the values */
    for (size_t cur = next_exception; i != end_exception;
         cur = next_exception) {
      next_exception = cur + static_cast<size_t>(outputbegin[cur]) + 1;
      outputbegin[cur] = *(i++);
    }
  }